

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O0

bool deqp::gles31::Functional::anon_unknown_0::paramsValid(TestParams *params)

{
  TestParams *params_local;
  
  if ((params->initSingle & 1U) != 0) {
    if ((params->useSameName & 1U) != 0) {
      return false;
    }
    if ((((params->switchVtx & 1U) == 0) && ((params->switchFrg & 1U) == 0)) &&
       ((params->useCreateHelper & 1U) != 0)) {
      return false;
    }
    if ((params->switchVtx & 1U) != (params->switchFrg & 1U)) {
      return false;
    }
  }
  if (((params->useProgramUniform & 1U) == 0) || ((params->useUniform & 1U) != 0)) {
    if (((params->varyings).count == 0) &&
       (((params->varyings).vtxInterp != VARYINGINTERPOLATION_LAST ||
        ((params->varyings).frgInterp != VARYINGINTERPOLATION_LAST)))) {
      params_local._7_1_ = false;
    }
    else if (((params->varyings).vtxInterp == VARYINGINTERPOLATION_RANDOM) ||
            (((params->varyings).frgInterp == VARYINGINTERPOLATION_RANDOM ||
             (((params->varyings).vtxInterp == VARYINGINTERPOLATION_FLAT) ==
              ((params->varyings).frgInterp == VARYINGINTERPOLATION_FLAT))))) {
      params_local._7_1_ = true;
    }
    else {
      params_local._7_1_ = false;
    }
  }
  else {
    params_local._7_1_ = false;
  }
  return params_local._7_1_;
}

Assistant:

bool paramsValid (const TestParams& params)
{
	using namespace glu;

	// Final pipeline has a single program?
	if (params.initSingle)
	{
		// Cannot have conflicting names for uniforms or constants
		if (params.useSameName)
			return false;

		// CreateShaderProgram would never get called
		if (!params.switchVtx && !params.switchFrg && params.useCreateHelper)
			return false;

		// Must switch either all or nothing
		if (params.switchVtx != params.switchFrg)
			return false;
	}

	// ProgramUniform would never get called
	if (params.useProgramUniform && !params.useUniform)
		return false;

	// Interpolation is meaningless if we don't use an in/out variable.
	if (params.varyings.count == 0 &&
		!(params.varyings.vtxInterp == VARYINGINTERPOLATION_LAST &&
		  params.varyings.frgInterp == VARYINGINTERPOLATION_LAST))
		return false;

	// Mismatch by flat / smooth is not allowed. See Khronos bug #12630
	// \note: iterpolations might be RANDOM, causing generated varyings potentially match / mismatch anyway.
	//        This is checked later on. Here, we just make sure that we don't force the generator to generate
	//        only invalid varying configurations, i.e. there exists a valid varying configuration for this
	//        test param config.
	if ((params.varyings.vtxInterp != VARYINGINTERPOLATION_RANDOM) &&
		(params.varyings.frgInterp != VARYINGINTERPOLATION_RANDOM) &&
		(params.varyings.vtxInterp == VARYINGINTERPOLATION_FLAT) != (params.varyings.frgInterp == VARYINGINTERPOLATION_FLAT))
		return false;

	return true;
}